

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

OutPt * __thiscall ClipperLib::InsertPolyPtBetween(ClipperLib *this,OutPt *p1,OutPt *p2,IntPoint pt)

{
  undefined8 *puVar1;
  OutPt *this_00;
  OutPt *result;
  OutPt *p2_local;
  OutPt *p1_local;
  IntPoint pt_local;
  
  if ((OutPt *)this == p1) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "JoinError";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  }
  this_00 = (OutPt *)operator_new(0x28);
  OutPt::OutPt(this_00);
  (this_00->pt).X = (long64)p2;
  (this_00->pt).Y = pt.X;
  if (p1 == *(OutPt **)(this + 0x18)) {
    *(OutPt **)(this + 0x18) = this_00;
    p1->prev = this_00;
    this_00->next = p1;
    this_00->prev = (OutPt *)this;
  }
  else {
    p1->next = this_00;
    *(OutPt **)(this + 0x20) = this_00;
    this_00->next = (OutPt *)this;
    this_00->prev = p1;
  }
  return this_00;
}

Assistant:

OutPt* InsertPolyPtBetween(OutPt* p1, OutPt* p2, const IntPoint pt)
{
  if (p1 == p2) throw "JoinError";
  OutPt* result = new OutPt;
  result->pt = pt;
  if (p2 == p1->next)
  {
    p1->next = result;
    p2->prev = result;
    result->next = p2;
    result->prev = p1;
  } else
  {
    p2->next = result;
    p1->prev = result;
    result->next = p1;
    result->prev = p2;
  }
  return result;
}